

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spvIR.h
# Opt level: O2

void __thiscall
spv::Block::addInstruction
          (Block *this,unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *inst)

{
  Instruction *instruction;
  
  instruction = (inst->_M_t).
                super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>._M_t
                .super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
                super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl;
  std::
  vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,std::allocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
  ::emplace_back<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>
            ((vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,std::allocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
              *)&this->instructions,inst);
  instruction->block = this;
  if (instruction->resultId != 0) {
    Module::mapInstruction(this->parent->parent,instruction);
    return;
  }
  return;
}

Assistant:

__inline void Block::addInstruction(std::unique_ptr<Instruction> inst)
{
    Instruction* raw_instruction = inst.get();
    instructions.push_back(std::move(inst));
    raw_instruction->setBlock(this);
    if (raw_instruction->getResultId())
        parent.getParent().mapInstruction(raw_instruction);
}